

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int check_OPP_for_Boolean_matching(saucy *s,coloring *c)

{
  char *pcVar1;
  char *name;
  int countN2Right;
  int countN1Right;
  int countN2Left;
  int countN1Left;
  int cell;
  int j;
  coloring *c_local;
  saucy *s_local;
  
  if (c != &s->left) {
    for (countN2Left = 0; countN2Left < s->n;
        countN2Left = (s->right).clen[countN2Left] + 1 + countN2Left) {
      name._0_4_ = 0;
      name._4_4_ = 0;
      countN2Right = 0;
      countN1Right = 0;
      for (countN1Left = countN2Left; countN1Left <= countN2Left + (s->right).clen[countN2Left];
          countN1Left = countN1Left + 1) {
        pcVar1 = getVertexName(s->pNtk,(s->left).lab[countN1Left]);
        if ((*pcVar1 != 'N') || (pcVar1[2] != ':')) {
          __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                        ,0x613,
                        "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
        }
        if (pcVar1[1] == '1') {
          countN1Right = countN1Right + 1;
        }
        else {
          if (pcVar1[1] != '2') {
            __assert_fail("name[1] == \'2\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x617,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          countN2Right = countN2Right + 1;
        }
        pcVar1 = getVertexName(s->pNtk,(s->right).lab[countN1Left]);
        if ((*pcVar1 != 'N') || (pcVar1[2] != ':')) {
          __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                        ,0x61c,
                        "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
        }
        if (pcVar1[1] == '1') {
          name._4_4_ = name._4_4_ + 1;
        }
        else {
          if (pcVar1[1] != '2') {
            __assert_fail("name[1] == \'2\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x620,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          name._0_4_ = (int)name + 1;
        }
      }
      if ((countN1Right != (int)name) || (countN2Right != name._4_4_)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int
check_OPP_for_Boolean_matching(struct saucy *s, struct coloring *c)
{
    int j, cell;
    int countN1Left, countN2Left;
    int countN1Right, countN2Right;
    char *name; 

    if (c == &s->left)
        return 1;       

    for (cell = 0; cell < s->n; cell += (s->right.clen[cell]+1)) {  
        countN1Left = countN2Left = countN1Right = countN2Right = 0;

        for (j = cell; j <= (cell+s->right.clen[cell]); j++) {

            name = getVertexName(s->pNtk, s->left.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1')
                countN1Left++;
            else {
                assert(name[1] == '2');
                countN2Left++;
            }

            name = getVertexName(s->pNtk, s->right.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1') 
                countN1Right++;
            else {
                assert(name[1] == '2');
                countN2Right++;
            }

        }

        if (countN1Left != countN2Right || countN2Left != countN1Right)
            return 0;
    }   
    
    return 1;
}